

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O2

int ReturnTest(void)

{
  AssertionResult iutest_ar;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  undefined1 local_8;
  
  local_28 = local_18;
  local_20 = 0;
  local_18[0] = 0;
  local_8 = 1;
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int ReturnTest()
{
    IUTEST_ASSERT_TRUE(true) << ::iutest::AssertionReturn(-1);
    return 0;
}